

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexutils.cpp
# Opt level: O1

bool QHexUtils::PatternUtils::match(QByteArray *data,QString *pattern)

{
  char cVar1;
  CutResult CVar2;
  ulong uVar3;
  bool bVar4;
  char16_t *pcVar5;
  QGlobalStatic<QString,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::guard>
  *this;
  long lVar6;
  qsizetype qVar7;
  long lVar8;
  bool bVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  bool ok;
  ulong local_48;
  QByteArray *local_40;
  qsizetype local_38;
  
  this = (QGlobalStatic<QString,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::guard>
          *)(pattern->d).size;
  bVar4 = (long)this < 2;
  if ((1 < (long)this) && (0 < (data->d).size)) {
    lVar6 = 2;
    lVar8 = 1;
    local_40 = data;
    do {
      local_48 = lVar6 - 2;
      pcVar5 = (pattern->d).ptr;
      local_38 = 2;
      CVar2 = QtPrivate::QContainerImplHelper::mid((qsizetype)this,(qsizetype *)&local_48,&local_38)
      ;
      if (CVar2 == Null) {
        qVar7 = 0;
        pcVar5 = (char16_t *)0x0;
      }
      else {
        pcVar5 = pcVar5 + local_48;
        qVar7 = local_38;
      }
      _GLOBAL__N_1::
      QGlobalStatic<QString,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::guard>
      ::operator*(this);
      if (qVar7 == (anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction()::holder._16_8_) {
        QVar10.m_data = pcVar5;
        QVar10.m_size = qVar7;
        QVar12.m_data =
             (storage_type_conflict *)
             (anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction()::holder._8_8_;
        QVar12.m_size = (anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction()::holder._16_8_;
        cVar1 = QtPrivate::equalStrings(QVar10,QVar12);
        bVar9 = false;
        if (cVar1 == '\0') goto LAB_001cbbc3;
      }
      else {
LAB_001cbbc3:
        local_48 = local_48 & 0xffffffffffffff00;
        QVar11.m_data = pcVar5;
        QVar11.m_size = qVar7;
        uVar3 = QString::toIntegral_helper(QVar11,(bool *)&local_48,0x10);
        if (uVar3 >> 0x20 != 0) {
          local_48 = 0;
          uVar3 = 0;
        }
        bVar9 = true;
        if (local_48._0_1_ == true) {
          bVar9 = (char)uVar3 != (local_40->d).ptr[lVar8 + -1];
        }
      }
      if (bVar9) {
        return bVar4;
      }
      this = (QGlobalStatic<QString,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::innerFunction,_QHexUtils::PatternUtils::(anonymous_namespace)::Q_QGS_WILDCARD_BYTE::guard>
              *)(pattern->d).size;
      bVar4 = (long)(this + -2) < lVar6;
      if ((long)(this + -2) < lVar6) {
        return bVar4;
      }
      lVar6 = lVar6 + 2;
      bVar9 = lVar8 < (local_40->d).size;
      lVar8 = lVar8 + 1;
    } while (bVar9);
  }
  return bVar4;
}

Assistant:

bool match(const QByteArray& data, const QString& pattern) {
    for(qint64 i = 0, idx = 0; (i <= (pattern.size() - 2)); i += 2, idx++) {
        if(idx >= data.size())
            return false;

#if QT_VERSION >= QT_VERSION_CHECK(6, 0, 0)
        QStringView hexb = QStringView{pattern}.mid(i, 2);
#else
        const QStringRef& hexb = pattern.midRef(i, 2);
#endif

        if(hexb == *WILDCARD_BYTE)
            continue;

        bool ok = false;
        auto b = static_cast<char>(hexb.toUInt(&ok, 16));
        if(!ok || (b != data.at(idx)))
            return false;
    }

    return true;
}